

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O3

void __thiscall
Generator_hodgkinHuxleySquidAxonModel1952WithAlgebraicVariableAsExternalVariable_Test::TestBody
          (Generator_hodgkinHuxleySquidAxonModel1952WithAlgebraicVariableAsExternalVariable_Test
           *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr *psVar3;
  char cVar4;
  char *pcVar5;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  GeneratorPtr generator;
  AnalyserModelPtr analyserModel;
  AnalyserPtr analyser;
  ModelPtr model;
  ParserPtr parser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  long *local_d8 [2];
  long local_c8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  internal local_98 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  shared_ptr *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  string local_78 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  string *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  shared_ptr *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  string local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  undefined1 local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  libcellml::Parser::create(SUB81(local_30,0));
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d8,"generator/hodgkin_huxley_squid_axon_model_1952/model.cellml","");
  fileContents((string *)&local_f8);
  libcellml::Parser::parseModel(local_40);
  paVar1 = &local_f8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],local_c8[0] + 1);
  }
  local_d8[0] = (long *)0x0;
  local_b8._M_dataplus._M_p = (pointer)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_f8,"size_t(0)","parser->issueCount()",(unsigned_long *)local_d8,
             (unsigned_long *)&local_b8);
  if ((char)local_f8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_d8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)(undefined1 *)local_f8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x5c3,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if (local_d8[0] != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_d8[0] != (long *)0x0)) {
        (**(code **)(*local_d8[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_f8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Analyser::create();
  psVar3 = local_50;
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"membrane","");
  libcellml::ComponentEntity::component((string *)&local_88,(bool)local_40[0]);
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"i_Stim","");
  libcellml::Component::variable(local_78);
  libcellml::AnalyserExternalVariable::create((shared_ptr *)&local_b8);
  libcellml::Analyser::addExternalVariable(psVar3);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length);
  }
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],local_c8[0] + 1);
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  libcellml::Analyser::analyseModel(local_50);
  local_d8[0] = (long *)0x0;
  local_b8._M_dataplus._M_p = (pointer)libcellml::Logger::errorCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_f8,"size_t(0)","analyser->errorCount()",(unsigned_long *)local_d8,
             (unsigned_long *)&local_b8);
  if ((char)local_f8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_d8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)(undefined1 *)local_f8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x5cb,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if (local_d8[0] != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_d8[0] != (long *)0x0)) {
        (**(code **)(*local_d8[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_f8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Analyser::model();
  libcellml::Generator::create();
  libcellml::Generator::setModel(local_88);
  libcellml::Generator::profile();
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"model.algebraic.h","");
  libcellml::GeneratorProfile::setInterfaceFileNameString(local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d8,"generator/hodgkin_huxley_squid_axon_model_1952/model.algebraic.h",
             "");
  fileContents((string *)&local_f8);
  libcellml::Generator::interfaceCode_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_98,
             "fileContents(\"generator/hodgkin_huxley_squid_axon_model_1952/model.algebraic.h\")",
             "generator->interfaceCode()",&local_f8,&local_b8);
  paVar2 = &local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],local_c8[0] + 1);
  }
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_90.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_90.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x5d6,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d8,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_f8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d8,"generator/hodgkin_huxley_squid_axon_model_1952/model.algebraic.c",
             "");
  fileContents((string *)&local_f8);
  libcellml::Generator::implementationCode_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_98,
             "fileContents(\"generator/hodgkin_huxley_squid_axon_model_1952/model.algebraic.c\")",
             "generator->implementationCode()",&local_f8,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],local_c8[0] + 1);
  }
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_90.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_90.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x5d7,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d8,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_f8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::GeneratorProfile::create((Profile)&local_f8);
  this_00 = p_Stack_60;
  p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length;
  local_68 = (string *)local_f8._M_dataplus._M_p;
  local_f8._M_dataplus._M_p = (pointer)0x0;
  local_f8._M_string_length = 0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length);
    }
  }
  libcellml::Generator::setProfile(local_88);
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d8,"generator/hodgkin_huxley_squid_axon_model_1952/model.algebraic.py",
             "");
  fileContents((string *)&local_f8);
  libcellml::Generator::implementationCode_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_98,
             "fileContents(\"generator/hodgkin_huxley_squid_axon_model_1952/model.algebraic.py\")",
             "generator->implementationCode()",&local_f8,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],local_c8[0] + 1);
  }
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_90.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_90.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x5dd,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d8,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d8);
    if ((long *)local_f8._M_dataplus._M_p != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && ((long *)local_f8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_f8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

TEST(Generator, hodgkinHuxleySquidAxonModel1952WithAlgebraicVariableAsExternalVariable)
{
    // Generate some code for the HH52 model with membrane.i_Stim as an external
    // variable.

    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto analyser = libcellml::Analyser::create();

    analyser->addExternalVariable(libcellml::AnalyserExternalVariable::create(model->component("membrane")->variable("i_Stim")));

    analyser->analyseModel(model);

    EXPECT_EQ(size_t(0), analyser->errorCount());

    auto analyserModel = analyser->model();
    auto generator = libcellml::Generator::create();

    generator->setModel(analyserModel);

    auto profile = generator->profile();

    profile->setInterfaceFileNameString("model.algebraic.h");

    EXPECT_EQ(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.algebraic.h"), generator->interfaceCode());
    EXPECT_EQ(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.algebraic.c"), generator->implementationCode());

    profile = libcellml::GeneratorProfile::create(libcellml::GeneratorProfile::Profile::PYTHON);

    generator->setProfile(profile);

    EXPECT_EQ(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.algebraic.py"), generator->implementationCode());
}